

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdGetPsbtUtxoDataByIndex
              (void *handle,void *psbt_handle,uint32_t index,char **txid,uint32_t *vout,
              int64_t *amount,char **locking_script,char **redeem_script,char **descriptor,
              char **full_tx_hex)

{
  undefined1 *puVar1;
  pointer pKVar2;
  char cVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int64_t iVar9;
  long *plVar10;
  undefined8 *puVar11;
  char *pcVar12;
  CfdException *this;
  size_type *psVar13;
  Pubkey *this_00;
  pointer this_01;
  char **ppcVar14;
  char *pcVar15;
  uint32_t req_num;
  char *work_tx;
  char *work_redeem_script;
  char *work_locking_script;
  char *work_txid;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  char *work_descriptor;
  TxOutReference txout;
  OutPoint outpoint;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> multisig_key_list;
  Script temp_script;
  Script script;
  Transaction tx;
  TxInReference txin;
  UtxoData utxo;
  string local_7c8;
  string local_7a8;
  void *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  uint32_t local_764;
  char *local_760;
  char **local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_730;
  Pubkey *local_718;
  undefined8 local_710;
  undefined1 local_708 [16];
  undefined1 local_6f8 [64];
  OutPoint local_6b8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_690;
  undefined1 local_678 [16];
  undefined1 local_668 [64];
  Script local_628;
  Transaction local_5f0;
  AbstractTxInReference local_5b0;
  undefined1 local_520 [568];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  Amount local_2c8 [41];
  
  local_738 = (char *)0x0;
  local_740 = (char *)0x0;
  local_748 = (char *)0x0;
  local_710 = 0;
  local_750 = (char *)0x0;
  local_788 = handle;
  cfd::Initialize();
  puVar1 = local_520 + 0x10;
  local_520._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_520);
  if ((undefined1 *)local_520._0_8_ != puVar1) {
    operator_delete((void *)local_520._0_8_);
  }
  if (*(Psbt **)((long)psbt_handle + 0x18) == (Psbt *)0x0) {
    local_520._0_8_ = "cfdcapi_psbt.cpp";
    local_520._8_4_ = 0x49a;
    local_520._16_8_ = "CfdGetPsbtUtxoDataByIndex";
    cfd::core::logger::log<>((CfdSourceLocation *)local_520,kCfdLogLevelWarning,"psbt is null.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    local_520._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_520,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_520);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Psbt::GetTransaction((Transaction *)local_520,*(Psbt **)((long)psbt_handle + 0x18));
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_5b0,(Transaction *)local_520,index);
  cfd::core::Transaction::~Transaction((Transaction *)local_520);
  cfd::core::OutPoint::OutPoint(&local_6b8,&local_5b0.txid_,local_5b0.vout_);
  if (txid == (char **)0x0) {
    local_770 = (char *)0x0;
  }
  else {
    cfd::core::OutPoint::GetTxid((Txid *)local_708,&local_6b8);
    cfd::core::Txid::GetHex_abi_cxx11_((string *)local_520,(Txid *)local_708);
    local_770 = cfd::capi::CreateString((string *)local_520);
    local_738 = local_770;
    if ((undefined1 *)local_520._0_8_ != puVar1) {
      operator_delete((void *)local_520._0_8_);
    }
    local_708._0_8_ = &PTR__Txid_00723450;
    if ((pointer)local_708._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_708._8_8_);
    }
  }
  if (vout != (uint32_t *)0x0) {
    uVar7 = cfd::core::OutPoint::GetVout(&local_6b8);
    *vout = uVar7;
  }
  local_758 = txid;
  cfd::Psbt::GetUtxoData((UtxoData *)local_520,*(Psbt **)((long)psbt_handle + 0x18),index,kMainnet);
  bVar4 = cfd::core::Script::IsEmpty((Script *)(local_520 + 0x50));
  if (bVar4) {
    local_760 = (char *)0x0;
  }
  else {
    if (locking_script == (char **)0x0) {
      local_760 = (char *)0x0;
    }
    else {
      cfd::core::Script::GetHex_abi_cxx11_((string *)local_708,(Script *)(local_520 + 0x50));
      local_760 = cfd::capi::CreateString((string *)local_708);
      local_740 = local_760;
      if ((undefined1 *)local_708._0_8_ != local_6f8) {
        operator_delete((void *)local_708._0_8_);
      }
    }
    if (amount != (int64_t *)0x0) {
      iVar9 = cfd::core::Amount::GetSatoshiValue((Amount *)(local_520 + 600));
      *amount = iVar9;
    }
  }
  cfd::core::Psbt::GetTxInRedeemScript
            (&local_628,*(Psbt **)((long)psbt_handle + 0x18),index,true,(bool *)0x0);
  ppcVar14 = local_758;
  bVar4 = cfd::core::Script::IsEmpty(&local_628);
  if ((bVar4) ||
     (bVar4 = cfd::core::Script::IsP2wpkhScript(&local_628), redeem_script == (char **)0x0 || bVar4)
     ) {
    local_778 = (char *)0x0;
  }
  else {
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_708,&local_628);
    local_778 = cfd::capi::CreateString((string *)local_708);
    local_748 = local_778;
    if ((undefined1 *)local_708._0_8_ != local_6f8) {
      operator_delete((void *)local_708._0_8_);
    }
  }
  cfd::core::Psbt::GetTxInUtxoFull
            (&local_5f0,*(Psbt **)((long)psbt_handle + 0x18),index,true,(bool *)0x0);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)local_708);
  uVar7 = cfd::core::Transaction::GetTxOutCount(&local_5f0);
  uVar8 = cfd::core::OutPoint::GetVout(&local_6b8);
  if (uVar8 < uVar7) {
    uVar7 = cfd::core::OutPoint::GetVout(&local_6b8);
    cfd::core::Transaction::GetTxOut((TxOutReference *)local_678,&local_5f0,uVar7);
    local_6f8[0] = local_668[0];
    local_708._8_8_ = local_678._8_8_;
    cfd::core::Script::operator=((Script *)(local_6f8 + 8),(Script *)(local_668 + 8));
    local_678._0_8_ = &PTR__AbstractTxOutReference_00723740;
    cfd::core::Script::~Script((Script *)(local_668 + 8));
    if (full_tx_hex == (char **)0x0) {
      local_780 = (char *)0x0;
    }
    else {
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)local_678,&local_5f0.super_AbstractTransaction);
      local_780 = cfd::capi::CreateString((string *)local_678);
      local_750 = local_780;
      if ((undefined1 *)local_678._0_8_ != local_668) {
        operator_delete((void *)local_678._0_8_);
      }
    }
  }
  else {
    local_780 = (char *)0x0;
  }
  cfd::core::Psbt::GetTxInKeyDataList(&local_730,*(Psbt **)((long)psbt_handle + 0x18),index);
  pcVar15 = local_770;
  if ((char *)local_2e8._M_string_length != (char *)0x0) {
    bVar4 = false;
    goto LAB_00416398;
  }
  cfd::core::Script::Script((Script *)local_678,(Script *)(local_6f8 + 8));
  bVar4 = cfd::core::Script::IsP2shScript((Script *)local_678);
  if ((bVar4) && (bVar4 = cfd::core::Script::IsMultisigScript(&local_628), bVar4)) {
    local_764 = 0;
    cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript(&local_690,&local_628,&local_764);
    uVar7 = local_764;
    cVar5 = '\x01';
    if (9 < local_764) {
      uVar8 = local_764;
      cVar3 = '\x04';
      do {
        cVar5 = cVar3;
        if (uVar8 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_00415fee;
        }
        if (uVar8 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_00415fee;
        }
        if (uVar8 < 10000) goto LAB_00415fee;
        bVar4 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar5 + '\x04';
      } while (bVar4);
      cVar5 = cVar5 + '\x01';
    }
LAB_00415fee:
    local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_7a8,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_7a8._M_dataplus._M_p,(uint)local_7a8._M_string_length,uVar7);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_7a8,0,(char *)0x0,0x5de53c);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_7c8.field_2._M_allocated_capacity = *psVar13;
      local_7c8.field_2._8_8_ = plVar10[3];
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
    }
    else {
      local_7c8.field_2._M_allocated_capacity = *psVar13;
      local_7c8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_7c8._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)(local_520 + 0x238),(string *)&local_7c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
      operator_delete(local_7a8._M_dataplus._M_p);
    }
    local_718 = local_690.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    this_00 = local_690.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_690.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_690.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pKVar2 = local_730.
                 super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if (local_730.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_730.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_004161f9:
          cfd::core::Pubkey::GetHex_abi_cxx11_(&local_7a8,this_00);
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_7a8,0,(char *)0x0,0x5d5c6f);
          local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
          psVar13 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_7c8.field_2._M_allocated_capacity = *psVar13;
            local_7c8.field_2._8_8_ = puVar11[3];
          }
          else {
            local_7c8.field_2._M_allocated_capacity = *psVar13;
            local_7c8._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_7c8._M_string_length = puVar11[1];
          *puVar11 = psVar13;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::_M_append(local_520 + 0x238,(ulong)local_7c8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
            operator_delete(local_7c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
            operator_delete(local_7a8._M_dataplus._M_p);
          }
        }
        else {
          bVar4 = false;
          this_01 = local_730.
                    super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            while( true ) {
              cfd::core::KeyData::GetPubkey((Pubkey *)&local_7c8,this_01);
              bVar6 = cfd::core::Pubkey::Equals(this_00,(Pubkey *)&local_7c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7c8._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_7c8._M_dataplus._M_p);
              }
              if (bVar6) break;
              this_01 = this_01 + 1;
              if (this_01 == pKVar2) {
                if (!bVar4) goto LAB_004161f9;
                goto LAB_004162a3;
              }
            }
            cfd::core::KeyData::ToString_abi_cxx11_(&local_7a8,this_01,true,kApostrophe,false);
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_7a8,0,(char *)0x0,0x5d5c6f);
            local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
            psVar13 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_7c8.field_2._M_allocated_capacity = *psVar13;
              local_7c8.field_2._8_8_ = puVar11[3];
            }
            else {
              local_7c8.field_2._M_allocated_capacity = *psVar13;
              local_7c8._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_7c8._M_string_length = puVar11[1];
            *puVar11 = psVar13;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::_M_append(local_520 + 0x238,(ulong)local_7c8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
              operator_delete(local_7c8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
              operator_delete(local_7a8._M_dataplus._M_p);
            }
            this_01 = this_01 + 1;
            bVar4 = true;
          } while (this_01 != pKVar2);
        }
LAB_004162a3:
        this_00 = this_00 + 1;
      } while (this_00 != local_718);
    }
    std::operator+(&local_7a8,"sh(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_520 + 0x238));
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_7a8);
    ppcVar14 = local_758;
    pcVar15 = local_770;
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_7c8.field_2._M_allocated_capacity = *psVar13;
      local_7c8.field_2._8_8_ = plVar10[3];
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
    }
    else {
      local_7c8.field_2._M_allocated_capacity = *psVar13;
      local_7c8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_7c8._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)(local_520 + 0x238),(string *)&local_7c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
      operator_delete(local_7a8._M_dataplus._M_p);
    }
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_690);
  }
  else {
    bVar4 = cfd::core::Script::IsP2pkhScript((Script *)local_678);
    if (((bVar4) || (bVar4 = cfd::core::Script::IsP2pkScript((Script *)local_678), bVar4)) &&
       ((long)local_730.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_730.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x150)) {
      bVar4 = cfd::core::Script::IsP2pkhScript((Script *)local_678);
      if (bVar4) {
        pcVar12 = "pkh(";
LAB_00415f74:
        std::__cxx11::string::_M_replace
                  ((ulong)(local_520 + 0x238),0,(char *)local_2e8._M_string_length,(ulong)pcVar12);
      }
      else {
        bVar4 = cfd::core::Script::IsP2pkScript((Script *)local_678);
        if (bVar4) {
          pcVar12 = "pk(";
          goto LAB_00415f74;
        }
      }
      cfd::core::KeyData::ToString_abi_cxx11_
                (&local_7c8,
                 local_730.
                 super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
                 .super__Vector_impl_data._M_start,true,kApostrophe,false);
      std::__cxx11::string::_M_append(local_520 + 0x238,(ulong)local_7c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p);
      }
      std::__cxx11::string::append(local_520 + 0x238);
    }
  }
  cfd::core::Script::~Script((Script *)local_678);
  bVar4 = (char *)local_2e8._M_string_length == (char *)0x0;
LAB_00416398:
  pcVar12 = (char *)0x0;
  if ((descriptor != (char **)0x0) && (!bVar4)) {
    pcVar12 = cfd::capi::CreateString((string *)(local_520 + 0x238));
  }
  if (ppcVar14 != (char **)0x0) {
    *ppcVar14 = pcVar15;
  }
  if (locking_script != (char **)0x0) {
    *locking_script = local_760;
  }
  if (redeem_script != (char **)0x0) {
    *redeem_script = local_778;
  }
  if (descriptor != (char **)0x0) {
    *descriptor = pcVar12;
  }
  if (full_tx_hex != (char **)0x0) {
    *full_tx_hex = local_780;
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_730);
  local_708._0_8_ = &PTR__AbstractTxOutReference_00723740;
  cfd::core::Script::~Script((Script *)(local_6f8 + 8));
  cfd::core::Transaction::~Transaction(&local_5f0);
  cfd::core::Script::~Script(&local_628);
  cfd::UtxoData::~UtxoData((UtxoData *)local_520);
  local_6b8.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  if (local_6b8.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6b8.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_5b0);
  return 0;
}

Assistant:

int CfdGetPsbtUtxoDataByIndex(
    void* handle, void* psbt_handle, uint32_t index, char** txid,
    uint32_t* vout, int64_t* amount, char** locking_script,
    char** redeem_script, char** descriptor, char** full_tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_locking_script = nullptr;
  char* work_redeem_script = nullptr;
  char* work_descriptor = nullptr;
  char* work_tx = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    auto txin = psbt_obj->psbt->GetTransaction().GetTxIn(index);
    OutPoint outpoint = txin.GetOutPoint();
    if (txid != nullptr) {
      work_txid = CreateString(outpoint.GetTxid().GetHex());
    }
    if (vout != nullptr) *vout = outpoint.GetVout();

    auto utxo = psbt_obj->psbt->GetUtxoData(index);
    if (!utxo.locking_script.IsEmpty()) {
      if (locking_script != nullptr) {
        work_locking_script = CreateString(utxo.locking_script.GetHex());
      }
      if (amount != nullptr) *amount = utxo.amount.GetSatoshiValue();
    }

    Script script = psbt_obj->psbt->GetTxInRedeemScript(index, true);
    if ((!script.IsEmpty()) && (!script.IsP2wpkhScript()) &&
        (redeem_script != nullptr)) {
      work_redeem_script = CreateString(script.GetHex());
    }

    auto tx = psbt_obj->psbt->GetTxInUtxoFull(index, true);
    TxOutReference txout;
    if (tx.GetTxOutCount() > outpoint.GetVout()) {
      txout = tx.GetTxOut(outpoint.GetVout());
      if (full_tx_hex != nullptr) work_tx = CreateString(tx.GetHex());
    }

    auto key_list = psbt_obj->psbt->GetTxInKeyDataList(index);
    if (utxo.descriptor.empty()) {
      Script temp_script = txout.GetLockingScript();
      if (temp_script.IsP2shScript() && script.IsMultisigScript()) {
        uint32_t req_num = 0;
        auto multisig_key_list =
            ScriptUtil::ExtractPubkeysFromMultisigScript(script, &req_num);
        utxo.descriptor = "multi(" + std::to_string(req_num);
        for (const auto& pubkey : multisig_key_list) {
          bool is_find = false;
          for (const auto& key : key_list) {
            if (pubkey.Equals(key.GetPubkey())) {
              utxo.descriptor += "," + key.ToString();
              is_find = true;
            }
          }
          if (!is_find) {
            utxo.descriptor += "," + pubkey.GetHex();
          }
        }
        utxo.descriptor = "sh(" + utxo.descriptor + ")";
      } else if (temp_script.IsP2pkhScript() || temp_script.IsP2pkScript()) {
        if (key_list.size() == 1) {
          if (temp_script.IsP2pkhScript())
            utxo.descriptor = "pkh(";
          else if (temp_script.IsP2pkScript())
            utxo.descriptor = "pk(";
          utxo.descriptor += key_list[0].ToString();
          utxo.descriptor += ")";
        }
      }
    }
    if ((!utxo.descriptor.empty()) && (descriptor != nullptr)) {
      work_descriptor = CreateString(utxo.descriptor);
    }

    if (txid != nullptr) *txid = work_txid;
    if (locking_script != nullptr) *locking_script = work_locking_script;
    if (redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (descriptor != nullptr) *descriptor = work_descriptor;
    if (full_tx_hex != nullptr) *full_tx_hex = work_tx;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(
      &work_txid, &work_locking_script, &work_redeem_script, &work_descriptor,
      &work_tx);
  return result;
}